

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O1

void __thiscall icu_63::DateFormat::DateFormat(DateFormat *this,DateFormat *other)

{
  Format::Format(&this->super_Format,&other->super_Format);
  (this->super_Format).super_UObject._vptr_UObject = (_func_int **)&PTR__DateFormat_0047ce00;
  this->fCalendar = (Calendar *)0x0;
  this->fNumberFormat = (NumberFormat *)0x0;
  this->fBoolFlags = 0;
  this->fCapitalizationContext = UDISPCTX_CAPITALIZATION_NONE;
  operator=(this,other);
  return;
}

Assistant:

DateFormat::DateFormat(const DateFormat& other)
:   Format(other),
    fCalendar(0),
    fNumberFormat(0),
    fCapitalizationContext(UDISPCTX_CAPITALIZATION_NONE)
{
    *this = other;
}